

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::SCCAnalyzer(SCCAnalyzer *this,Options *options)

{
  _Rb_tree_header *p_Var1;
  
  Options::Options(&this->options_,options);
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->garbage_bin_).
  super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->garbage_bin_).
  super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->garbage_bin_).
  super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->analysis_cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stack_).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack_).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index_ = 0;
  return;
}

Assistant:

~SCCAnalyzer() {
    for (int i = 0; i < garbage_bin_.size(); i++) delete garbage_bin_[i];
  }